

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

void __thiscall MeCab::anon_unknown_0::LatticeImpl::~LatticeImpl(LatticeImpl *this)

{
  (this->super_Lattice)._vptr_Lattice = (_func_int **)&PTR_clear_0019e7d0;
  scoped_ptr<MeCab::Allocator<mecab_node_t,_mecab_path_t>_>::~scoped_ptr(&this->allocator_);
  scoped_ptr<MeCab::StringBuffer>::~scoped_ptr(&this->ostrs_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->boundary_constraint_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&(this->feature_constraint_).
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::~_Vector_base
            (&(this->begin_nodes_).
              super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>);
  std::_Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>::~_Vector_base
            (&(this->end_nodes_).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>
            );
  std::__cxx11::string::~string((string *)&this->what_);
  return;
}

Assistant:

void LatticeImpl::clear() {
  allocator_->free();
  if (ostrs_.get()) {
    ostrs_->clear();
  }
  begin_nodes_.clear();
  end_nodes_.clear();
  feature_constraint_.clear();
  boundary_constraint_.clear();
  size_ = 0;
  theta_ = kDefaultTheta;
  Z_ = 0.0;
  sentence_ = 0;
}